

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtimezoneprivate_tz.cpp
# Opt level: O0

QByteArray * anon_unknown.dwarf_10b2b6d::ZoneNameReader::etcContent(QString *path)

{
  uint uVar1;
  int __oflag;
  QByteArray *in_RDI;
  long in_FS_OFFSET;
  QIODevice *in_stack_00000068;
  QFile zone;
  undefined4 in_stack_ffffffffffffff78;
  OpenModeFlag in_stack_ffffffffffffff7c;
  QFlags<QIODeviceBase::OpenModeFlag> *in_stack_ffffffffffffff80;
  QString *name;
  undefined7 in_stack_ffffffffffffffa0;
  undefined1 in_stack_ffffffffffffffa7;
  uint local_1c;
  QString local_18;
  
  local_18.d.size = *(long *)(in_FS_OFFSET + 0x28);
  local_18.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_18.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  name = &local_18;
  QFile::QFile((QFile *)CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0),name);
  QFlags<QIODeviceBase::OpenModeFlag>::QFlags(in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
  uVar1 = QFile::open((QFile *)name,(char *)(ulong)local_1c,__oflag);
  if ((uVar1 & 1) == 0) {
    QByteArray::QByteArray((QByteArray *)0x75265e);
  }
  else {
    QIODevice::readAll(in_stack_00000068);
    QByteArray::trimmed((QByteArray *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78))
    ;
    QByteArray::~QByteArray((QByteArray *)0x752618);
  }
  QFile::~QFile((QFile *)0x752670);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18.d.size) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

static QByteArray etcContent(const QString &path)
    {
        QFile zone(path);
        if (zone.open(QIODevice::ReadOnly))
            return zone.readAll().trimmed();

        return QByteArray();
    }